

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetrepaintmanager.cpp
# Opt level: O0

void __thiscall QWidgetRepaintManager::removeDirtyWidget(QWidgetRepaintManager *this,QWidget *w)

{
  long lVar1;
  QWidgetPrivate *this_00;
  qsizetype qVar2;
  long in_RSI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QWidget *child;
  int i;
  int n;
  QWidgetPrivate *wd;
  QWidgetRepaintManager *in_stack_ffffffffffffffd0;
  int local_28;
  QWidget *w_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RSI != 0) {
    w_00 = in_RDI;
    QList<QWidget*>::removeAll<QWidget*>
              ((QList<QWidget_*> *)in_stack_ffffffffffffffd0,(QWidget **)in_RDI);
    QList<QWidget*>::removeAll<QWidget*>
              ((QList<QWidget_*> *)in_stack_ffffffffffffffd0,(QWidget **)in_RDI);
    resetWidget(in_stack_ffffffffffffffd0,in_RDI);
    QList<QWidget*>::removeAll<QWidget*>
              ((QList<QWidget_*> *)in_stack_ffffffffffffffd0,(QWidget **)in_RDI);
    this_00 = QWidget::d_func((QWidget *)0x3a51c4);
    qVar2 = QList<QObject_*>::size((QList<QObject_*> *)&this_00->field_0x18);
    for (local_28 = 0; local_28 < (int)qVar2; local_28 = local_28 + 1) {
      QList<QObject_*>::at((QList<QObject_*> *)in_stack_ffffffffffffffd0,(qsizetype)in_RDI);
      in_stack_ffffffffffffffd0 =
           (QWidgetRepaintManager *)qobject_cast<QWidget*>(&in_RDI->super_QObject);
      if (in_stack_ffffffffffffffd0 != (QWidgetRepaintManager *)0x0) {
        removeDirtyWidget((QWidgetRepaintManager *)this_00,w_00);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetRepaintManager::removeDirtyWidget(QWidget *w)
{
    if (!w)
        return;

    dirtyWidgets.removeAll(w);
    dirtyRenderToTextureWidgets.removeAll(w);
    resetWidget(w);

    needsFlushWidgets.removeAll(w);

    QWidgetPrivate *wd = w->d_func();
    const int n = wd->children.size();
    for (int i = 0; i < n; ++i) {
        if (QWidget *child = qobject_cast<QWidget*>(wd->children.at(i)))
            removeDirtyWidget(child);
    }
}